

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O2

void __thiscall
CompletionProvider::run
          (CompletionProvider *this,Id *id,
          optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          *paramsOpt)

{
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar1;
  Ch *__s;
  File *file;
  Point cursorPosition;
  CompletionList completions;
  string uri;
  char *local_e0;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_d8;
  CompletionList local_98;
  string local_78;
  Stack<rapidjson::CrtAllocator> local_58;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"Missing params for autocomplete request",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,__s,(allocator<char> *)&local_d8);
  file = FileManager::get(&local_78);
  if (file == (File *)0x0) {
    std::operator<<((ostream *)&std::cerr,"!!! Null file !!!\n");
    sendNullResult(id);
    goto LAB_0016ac53;
  }
  local_98.isIncomplete = false;
  local_98.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (file->type == Tex) {
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)paramsOpt,"position");
    cursorPosition = getPointFromJSON(pGVar1);
    getLatexCompletionsForFileAndPoint((CompletionList *)&local_d8,file,cursorPosition);
    CompletionList::operator=(&local_98,(CompletionList *)&local_d8);
    std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector
              ((vector<CompletionItem,_std::allocator<CompletionItem>_> *)&local_d8.level_stack_);
    if (local_98.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_98.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0016aaa6;
    local_d8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58;
    local_58.stack_ = (char *)0x0;
    local_58.stackTop_ = (char *)0x0;
    local_58.stackEnd_ = (char *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.initialCapacity_ = 0x100;
    local_d8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_d8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_d8.level_stack_.stackEnd_ = (char *)0x0;
    local_d8.level_stack_.stack_ = (char *)0x0;
    local_d8.level_stack_.stackTop_ = (char *)0x0;
    local_d8.level_stack_.initialCapacity_ = 0x200;
    local_d8.maxDecimalPlaces_ = 0x144;
    local_d8.hasRoot_ = false;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_d8);
    local_e0 = "jsonrpc";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_d8,&local_e0);
    local_e0 = "2.0";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_d8,&local_e0);
    local_e0 = "id";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_d8,&local_e0);
    Id::writeId(id,&local_d8);
    local_e0 = "result";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_d8,&local_e0);
    CompletionList::reflect(&local_98,&local_d8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_d8,0);
    sendMessage((StringBuffer *)&local_58);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_d8.level_stack_);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_58);
  }
  else {
LAB_0016aaa6:
    sendNullResult(id);
  }
  std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector(&local_98.items);
LAB_0016ac53:
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void CompletionProvider::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "Missing params for autocomplete request");
        return;
    }

    Value &params = *paramsOpt;

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    CompletionList completions;

    switch (file->type) {
        case File::Type::Tex:
            completions = getLatexCompletionsForFileAndPoint(*file, getPointFromJSON(params["position"]));
            break;
        case File::Type::Bib:
            // TODO
        default:
            sendNullResult(id);
            return;
    }

    if (completions.empty()) {
        sendNullResult(id);
    } else {
        INIT_WRITER
        ADD_ID(id);
        writer.Key("result"); completions.reflect(writer);
        SEND_MESSAGE
    }
}